

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void build_fire(CHAR_DATA *ch,int dur)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  CProficiencies *pCVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string buffer;
  char *local_38 [2];
  char *local_28;
  
  iVar1 = number_percent();
  if (ch->pcdata == (PC_DATA *)0x0) {
    pCVar4 = &prof_none;
  }
  else {
    pCVar4 = &ch->pcdata->profs;
  }
  iVar2 = CProficiencies::GetProf(pCVar4,"firestarting");
  if (iVar2 * 3 + 0x3c < iVar1) {
    act("$n\'s fire dies out despite $s best attempts to kindle it.",ch,(void *)0x0,(void *)0x0,0);
    act("Your fire dies out despite your best attempts to kindle it.",ch,(void *)0x0,(void *)0x0,3);
    if (ch->pcdata == (PC_DATA *)0x0) {
      pCVar4 = &prof_none;
    }
    else {
      pCVar4 = &ch->pcdata->profs;
    }
    CProficiencies::CheckImprove(pCVar4,"firestarting",300);
    return;
  }
  pcVar3 = get_char_color(ch,"lightred");
  local_28 = END_COLOR(ch);
  fmt.size_ = 0xcc;
  fmt.data_ = (char *)0x5b;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_38;
  local_38[0] = pcVar3;
  ::fmt::v9::vformat_abi_cxx11_
            (&buffer,(v9 *)
                     "{}The spark is caught by some dried brush, and it quickly erupts into a blazing campfire!{}"
             ,fmt,args);
  act(buffer._M_dataplus._M_p,ch,(void *)0x0,(void *)0x0,4);
  pObjIndex = get_obj_index(0x4c);
  obj = create_object(pObjIndex,(int)ch->level);
  if (ch->pcdata == (PC_DATA *)0x0) {
    pCVar4 = &prof_none;
  }
  else {
    pCVar4 = &ch->pcdata->profs;
  }
  iVar1 = CProficiencies::GetProf(pCVar4,"firestarting");
  obj->value[0] = iVar1 + 1;
  obj->timer = (short)dur;
  obj_to_room(obj,ch->in_room);
  add_prof_affect(ch,"firestarting",dur,false);
  if (ch->pcdata == (PC_DATA *)0x0) {
    pCVar4 = &prof_none;
  }
  else {
    pCVar4 = &ch->pcdata->profs;
  }
  CProficiencies::CheckImprove(pCVar4,"firestarting",0xfa);
  std::__cxx11::string::~string((string *)&buffer);
  return;
}

Assistant:

void build_fire(CHAR_DATA *ch, int dur)
{
	if (number_percent() > 60 + ch->Profs()->GetProf("firestarting") * 3)
	{
		act("$n's fire dies out despite $s best attempts to kindle it.", ch, 0, 0, TO_ROOM);
		act("Your fire dies out despite your best attempts to kindle it.", ch, 0, 0, TO_CHAR);
		ch->Profs()->CheckImprove("firestarting", 300);
		return;
	}

	auto buffer = fmt::format("{}The spark is caught by some dried brush, and it quickly erupts into a blazing campfire!{}",
		get_char_color(ch, "lightred"),
		END_COLOR(ch));
	act(buffer.c_str(), ch, 0, 0, TO_ALL);

	auto fire = create_object(get_obj_index(OBJ_VNUM_CAMPFIRE), ch->level);
	fire->value[0] = ch->Profs()->GetProf("firestarting") + 1;
	fire->timer = dur;
	obj_to_room(fire, ch->in_room);
	add_prof_affect(ch, "firestarting", dur);
	ch->Profs()->CheckImprove("firestarting", 250);
}